

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.cpp
# Opt level: O3

void __thiscall PrintCommand::doCommand(PrintCommand *this)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  unsigned_long uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R12;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  undefined1 local_88 [8];
  regex quote;
  string toPrint;
  ExpressionUtils expressionUtils;
  
  uVar4 = DataCommands::getIndex(this->dataCommands);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&toPrint.field_2 + 8),this->dataCommands);
  if (uVar4 + 1 <
      (ulong)((long)expressionUtils.deathMap.
                    super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                    super__Vector_impl_data._M_start - toPrint.field_2._8_8_ >> 5)) {
    lVar7 = (uVar4 + 1) * 0x20;
    lVar1 = *(long *)(toPrint.field_2._8_8_ + lVar7);
    quote._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&toPrint._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &quote._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,lVar1,*(long *)(toPrint.field_2._8_8_ + 8 + lVar7) + lVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&toPrint.field_2 + 8));
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88,"\".*\"",0x10);
    expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    toPrint.field_2._8_8_ = 0;
    expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    bVar3 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )quote._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(toPrint._M_dataplus._M_p +
                         (long)quote._M_automaton.
                               super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&toPrint.field_2 + 8),
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88,0);
    if (toPrint.field_2._8_8_ != 0) {
      operator_delete((void *)toPrint.field_2._8_8_,
                      (long)expressionUtils.deathMap.
                            super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - toPrint.field_2._8_8_);
    }
    if (bVar3) {
      std::__cxx11::string::substr
                ((ulong)((long)&toPrint.field_2 + 8),
                 (ulong)&quote._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)toPrint.field_2._8_8_,
                          (long)expressionUtils.deathMap.
                                super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((pointer *)toPrint.field_2._8_8_ !=
          &expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)toPrint.field_2._8_8_,
                        (long)expressionUtils.deathMap.
                              super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1);
      }
    }
    else {
      toPrint.field_2._8_8_ = 0;
      expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expressionUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      DataVars::getSymbolTable_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)&local_c0,this->dataVars);
      dVar2 = ExpressionUtils::calculateInfixStr
                        ((ExpressionUtils *)((long)&toPrint.field_2 + 8),
                         (string *)
                         &quote._M_automaton.
                          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          *)&local_c0);
      poVar5 = std::ostream::_M_insert<double>(dVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_c0);
      ExpressionUtils::~ExpressionUtils((ExpressionUtils *)((long)&toPrint.field_2 + 8));
    }
    DataCommands::setIndex(this->dataCommands,uVar4 + 2);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88);
    if (quote._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&toPrint._M_string_length) {
      operator_delete(quote._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,toPrint._M_string_length + 1);
    }
    return;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  ExpressionUtils::~ExpressionUtils((ExpressionUtils *)((long)&toPrint.field_2 + 8));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88);
  if (quote._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != unaff_R12) {
    operator_delete(quote._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,toPrint._M_string_length + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void PrintCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // Set the appropriate regular expression
    string toPrint=this->dataCommands->getSeparated().at(index + 1);
    regex quote("\".*\"");
    // Returns true if the nameInSimulator matches the regular expression of quotes and returns false if not
    if(regex_match(toPrint, quote)){
        cout<<toPrint.substr(1, toPrint.size() - 2)<<endl;
    }
    else{ //print Expression
        ExpressionUtils expressionUtils;
        cout<<expressionUtils.calculateInfixStr(toPrint,dataVars->getSymbolTable())<<endl;
    }
    index += 2;
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}